

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O0

Score Search::search<(Nodetype)2>(position *pos,int16 alpha,int16 beta,U16 depth,node *stack)

{
  int (*paaiVar1) [64] [64];
  position *ppVar2;
  bool bVar3;
  U16 UVar4;
  Color CVar5;
  Piece PVar6;
  Score *pSVar7;
  Searchthread *t;
  long lVar8;
  int iVar9;
  float fVar10;
  Score local_394;
  Score local_384;
  Score local_378;
  Score local_368;
  bool local_34d;
  byte local_34c;
  byte local_34b;
  byte local_34a;
  byte local_349;
  bool local_341;
  bool local_33a;
  bool local_338;
  bool local_332;
  Score local_2e8;
  ushort local_2e0;
  bool local_2db;
  Score local_2d8;
  Score local_2bc;
  Score local_2b8;
  Move *local_2a0;
  int16 local_296;
  U8 local_293;
  U8 local_292;
  U8 local_291;
  U64 local_290;
  uint local_288;
  int local_284;
  Bound bound;
  int bestMoveBonus;
  Movetype local_278;
  U8 local_272 [2];
  uint local_270;
  short local_26a;
  uint R_1;
  int16 LMR;
  Score local_260;
  short local_25c;
  short local_25a;
  Score score;
  int16 newdepth;
  int16 reductions;
  int16 extensions;
  bool givesCheck;
  bool dangerousQuietCheck;
  bool threatResponse;
  bool captureFollowup;
  bool quietFollowup;
  bool quietFollowingCapture;
  Square local_248;
  bool local_243;
  byte local_242;
  byte local_241;
  Movetype local_240;
  bool advancedPawnPush;
  bool isEvasion;
  bool isQuiet;
  bool isCapture;
  bool isPromotion;
  bool hashOrKiller;
  uint local_218;
  Move local_211;
  byte local_20e;
  byte local_20d;
  int local_20c;
  bool rootMoves;
  Color CStack_208;
  bool skipQuiets;
  int SEE;
  Color to_mv;
  undefined1 local_1fb;
  bool improving;
  Move pre_pre_move;
  Move pre_move;
  Move move;
  Moveorder mvs;
  Move local_187;
  Score SStack_184;
  U16 moves_searched;
  U16 UStack_180;
  Move tm;
  Score null_eval;
  int16 ndepth;
  int16 R;
  bool null_move_allowed;
  bool forward_prune;
  uint uStack_174;
  bool hasStaticValue;
  Score local_170;
  undefined1 local_16c;
  byte local_16b;
  ushort local_16a;
  Score static_eval;
  bool weHavePawnsOn7th;
  bool anyPawnsOn7th;
  undefined1 local_160 [8];
  hash_data e;
  bool hashHit;
  Score local_148;
  Score mated_score;
  undefined4 local_140;
  Score mating_score;
  bool local_12c [2];
  U16 local_12a;
  undefined1 local_128 [4];
  bool pvNode;
  bool root_node;
  U16 root_dist;
  vector<Move,_std::allocator<Move>_> quiets;
  Move local_108;
  bool in_check;
  Score ttvalue;
  Move pv [68];
  Move ttm;
  size_t deferred;
  Move best_move;
  node *pnStack_28;
  Score bestScore;
  node *stack_local;
  U16 depth_local;
  int16 beta_local;
  position *ppStack_18;
  int16 alpha_local;
  position *pos_local;
  
  if (UCI_SIGNALS.stop) {
    return draw;
  }
  pnStack_28 = stack;
  stack_local._2_2_ = depth;
  stack_local._4_2_ = beta;
  stack_local._6_2_ = alpha;
  ppStack_18 = pos;
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DoubleEspresso[P]chess/src/search.hpp"
                  ,0x139,
                  "Score Search::search(position &, int16, int16, U16, node *) [type = non_pv]");
  }
  deferred._4_4_ = ninf;
  Move::Move((Move *)((long)&deferred + 1));
  deferred._3_1_ = 0x11;
  stack0xffffffffffffffc8 = 0;
  Move::Move((Move *)&pv[0x41].type);
  pv[0x42].t = '\x11';
  local_2a0 = &local_108;
  do {
    Move::Move(local_2a0);
    local_2a0 = local_2a0 + 1;
  } while (local_2a0 != (Move *)&pv[0x41].t);
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = ninf;
  quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = position::in_check(ppStack_18);
  std::vector<Move,_std::allocator<Move>_>::vector((vector<Move,_std::allocator<Move>_> *)local_128)
  ;
  pnStack_28->in_check =
       (bool)(quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._3_1_ & 1);
  pnStack_28->ply = pnStack_28[-1].ply + 1;
  local_12a = pnStack_28->ply;
  local_12c[1] = false;
  local_12c[0] = false;
  if (((quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._3_1_ & 1) == 0) && (bVar3 = position::is_draw(ppStack_18), bVar3)) {
    pos_local._4_4_ = draw;
    local_140 = 1;
    goto LAB_0016dfc9;
  }
  mated_score = mate - (uint)local_12a;
  local_148 = (Score)stack_local._4_2_;
  pSVar7 = std::min<Score>(&mated_score,&local_148);
  stack_local._4_2_ = (int16)*pSVar7;
  if (mated_score <= (short)stack_local._6_2_) {
    pos_local._4_4_ = mated_score;
    local_140 = 1;
    goto LAB_0016dfc9;
  }
  register0x00000000 = (uint)local_12a + mated;
  e._8_4_ = SEXT24((short)stack_local._6_2_);
  pSVar7 = std::max<Score>((Score *)&e.move.type,(Score *)&e.dkey);
  stack_local._6_2_ = (ushort)*pSVar7;
  if (stack_local._4_2_ <= stack0xfffffffffffffeb4) {
    pos_local._4_4_ = stack0xfffffffffffffeb4;
    local_140 = 1;
    goto LAB_0016dfc9;
  }
  e.pkey._1_1_ = 0;
  hash_data::hash_data((hash_data *)local_160);
  _static_eval = position::key(ppStack_18);
  e.pkey._1_1_ = hash_table::fetch(&ttable,(U64 *)&static_eval,(hash_data *)local_160);
  if ((bool)e.pkey._1_1_) {
    Move::operator=((Move *)&pv[0x41].type,(Move *)&e.age);
    hashHits = hashHits + 1;
    quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (Score)(short)local_160._4_2_;
    if ((int)(uint)stack_local._2_2_ <= (int)local_160[0]) {
      if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < stack_local._4_2_) {
        if (local_160[1] == '\x01') goto LAB_0016cd03;
      }
      else if (local_160[1] == '\0') {
LAB_0016cd03:
        local_16a = stack_local._2_2_;
        position::stats_update
                  (ppStack_18,(Move *)&pv[0x41].type,&pnStack_28[-1].curr_move,(int16 *)&local_16a,
                   (Score *)((long)&quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 4),
                   (vector<Move,_std::allocator<Move>_> *)local_128,pnStack_28->killers);
        pos_local._4_4_ =
             quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_;
        local_140 = 1;
        goto LAB_0016dfc9;
      }
    }
  }
  local_16b = position::pawns_near_promotion(ppStack_18);
  local_16c = position::pawns_on_7th(ppStack_18);
  ppVar2 = ppStack_18;
  if (quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ == ninf) {
    if (((pnStack_28[-2].static_eval == ninf) ||
        ((quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._3_1_ & 1) != 0)) ||
       (pnStack_28[-2].static_eval < pnStack_28[-1].static_eval)) {
      if ((quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._3_1_ & 1) == 0) {
        UVar4 = position::id(ppStack_18);
        uStack_174 = (uint)UVar4;
        t = Threadpool<Searchthread>::operator[](&SearchThreads,(int *)&stack0xfffffffffffffe8c);
        _ndepth = lazy_eval_margin_search((uint)stack_local._2_2_,(bool)(local_16b & 1));
        fVar10 = eval::evaluate(ppVar2,t,(float *)&ndepth);
        lVar8 = std::lround((double)(ulong)(uint)fVar10);
        local_2d8 = (Score)lVar8;
      }
      else {
        local_2d8 = ninf;
      }
      local_2bc = local_2d8;
    }
    else {
      local_2bc = pnStack_28[-2].static_eval + 0xf;
    }
    local_2b8 = local_2bc;
  }
  else {
    local_2b8 = quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  local_170 = local_2b8;
  pnStack_28->static_eval = local_2b8;
  bVar3 = false;
  if ((((quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._3_1_ & 1) == 0) &&
      (bVar3 = false, pnStack_28[-1].curr_move.type == '\n')) &&
     (bVar3 = false, (pnStack_28->null_search & 1U) == 0)) {
    iVar9 = (int)(short)stack_local._6_2_ - (int)stack_local._4_2_;
    if (iVar9 < 1) {
      iVar9 = -iVar9;
    }
    bVar3 = false;
    if (iVar9 == 1) {
      bVar3 = local_2b8 != ninf;
    }
  }
  CVar5 = position::to_move(ppStack_18);
  if (CVar5 == white) {
    local_2db = position::non_pawn_material<(Color)0>(ppStack_18);
  }
  else {
    local_2db = position::non_pawn_material<(Color)1>(ppStack_18);
  }
  if (((bVar3) && (local_2db != false)) &&
     ((5 < stack_local._2_2_ &&
      ((int)stack_local._4_2_ <= local_170 + (0x40 - (uint)stack_local._2_2_) * -8)))) {
    if (stack_local._2_2_ < 6) {
      local_2e0 = 2;
    }
    else {
      local_2e0 = stack_local._2_2_ / 2;
    }
    tm._1_2_ = local_2e0;
    UStack_180 = stack_local._2_2_ - local_2e0;
    pnStack_28[1].null_search = true;
    position::do_null_move(ppStack_18);
    if ((short)UStack_180 < 2) {
      local_2e8 = qsearch<(Nodetype)2>
                            (ppStack_18,-stack_local._4_2_,1 - stack_local._4_2_,0,pnStack_28 + 1);
    }
    else {
      local_2e8 = search<(Nodetype)2>(ppStack_18,-stack_local._4_2_,1 - stack_local._4_2_,UStack_180
                                      ,pnStack_28 + 1);
    }
    local_2e8 = -local_2e8;
    SStack_184 = local_2e8;
    position::undo_null_move(ppStack_18);
    pnStack_28[1].null_search = false;
    if (stack_local._4_2_ <= SStack_184) {
      pos_local._4_4_ = SStack_184;
      local_140 = 1;
      goto LAB_0016dfc9;
    }
    Move::Move(&local_187,&pnStack_28[1].best_move);
    if ((local_187.type == '\v') && (499 < stack_local._4_2_ - SStack_184)) {
      Move::operator=(&pnStack_28->threat_move,&local_187);
    }
  }
  mvs._102_2_ = 0;
  haVoc::Moveorder::Moveorder
            ((Moveorder *)&pre_pre_move.t,ppStack_18,(Move *)&pv[0x41].type,pnStack_28);
  Move::Move((Move *)&local_1fb);
  Move::Move((Move *)((long)&to_mv + 2),&pnStack_28[-1].curr_move);
  Move::Move((Move *)((long)&SEE + 3),&pnStack_28[-2].curr_move);
  SEE._2_1_ = -1 < pnStack_28->static_eval - pnStack_28[-2].static_eval;
  CStack_208 = position::to_move(ppStack_18);
  ppVar2 = ppStack_18;
  local_20c = 0;
  local_20d = 0;
  local_20e = 0;
  Move::Move(&local_211);
  UVar4 = position::id(ppStack_18);
  local_218 = (uint)UVar4;
  set_searching(ppVar2,&local_211,(int *)&local_218);
  do {
    do {
      do {
        do {
          bVar3 = haVoc::Moveorder::next_move
                            ((Moveorder *)&pre_pre_move.t,ppStack_18,(Move *)&local_1fb,
                             (Move *)((long)&to_mv + 2),(Move *)((long)&SEE + 3),
                             &pnStack_28->threat_move,(bool)(local_20d & 1),(bool)(local_20e & 1));
          if (!bVar3) goto LAB_0016de2c;
          if ((UCI_SIGNALS.stop & 1U) != 0) {
            pos_local._4_4_ = draw;
            goto LAB_0016dfad;
          }
        } while ((pre_pre_move.f == '\x11') ||
                (bVar3 = position::is_legal(ppStack_18,(Move *)&local_1fb), !bVar3));
        main_thread(ppStack_18);
        bVar3 = Move::operator==((Move *)&local_1fb,(Move *)&pv[0x41].type);
        local_332 = true;
        if (!bVar3) {
          bVar3 = Move::operator==((Move *)&local_1fb,pnStack_28->killers);
          local_332 = true;
          if (!bVar3) {
            bVar3 = Move::operator==((Move *)&local_1fb,pnStack_28->killers + 1);
            local_332 = true;
            if (!bVar3) {
              bVar3 = Move::operator==((Move *)&local_1fb,pnStack_28->killers + 2);
              local_332 = true;
              if (!bVar3) {
                local_332 = Move::operator==((Move *)&local_1fb,pnStack_28->killers + 3);
              }
            }
          }
        }
        isQuiet = local_332;
        isEvasion = position::is_promotion(ppStack_18,&pre_pre_move.f);
        local_338 = true;
        if ((pre_pre_move.f != '\v') && (local_338 = true, pre_pre_move.f != '\f')) {
          local_240 = (Movetype)pre_pre_move.f;
          local_338 = position::is_cap_promotion(ppStack_18,&local_240);
        }
        advancedPawnPush = local_338;
        local_241 = pre_pre_move.f == '\n';
        local_242 = quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._3_1_ & 1;
        local_248 = (Square)improving;
        PVar6 = position::piece_on(ppStack_18,&local_248);
        local_33a = false;
        if (PVar6 == pawn) {
          if (CStack_208 == white) {
            _threatResponse = (uint)improving;
            iVar9 = util::row((int *)&threatResponse);
            local_341 = 4 < iVar9;
          }
          else {
            _extensions = (uint)improving;
            iVar9 = util::row((int *)&extensions);
            local_341 = iVar9 < 3;
          }
          local_33a = local_341;
        }
        local_243 = local_33a;
        local_349 = 0;
        if (pnStack_28[-1].curr_move.type == '\v') {
          local_349 = local_241;
        }
        reductions._1_1_ = local_349 & 1;
        local_34a = 0;
        if (pnStack_28[-1].curr_move.type == '\n') {
          local_34a = local_241;
        }
        reductions._0_1_ = local_34a & 1;
        local_34b = 0;
        if (pnStack_28[-1].curr_move.type == '\v') {
          local_34b = advancedPawnPush;
        }
        newdepth._1_1_ = local_34b & 1;
        local_34c = 0;
        if (((pnStack_28->threat_move).type != '\x11') &&
           (local_34c = 0, (bool)(pnStack_28->threat_move).f == improving)) {
          local_34c = advancedPawnPush;
        }
        newdepth._0_1_ = local_34c & 1;
        local_34d = false;
        if ((local_241 & 1) != 0) {
          local_34d = position::quiet_gives_dangerous_check(ppStack_18,(Move *)&local_1fb);
        }
        score._3_1_ = local_34d;
      } while (((((advancedPawnPush & 1U) != 0) && ((isQuiet & 1U) == 0)) && ((local_242 & 1) == 0))
              && ((((isEvasion & 1U) == 0 && (deferred._4_4_ < (short)stack_local._6_2_)) &&
                  ((stack_local._2_2_ < 2 &&
                   ((1 < (ushort)mvs._102_2_ &&
                    (local_20c = position::see(ppStack_18,(Move *)&local_1fb), local_20c < 0))))))))
      ;
      position::do_move(ppStack_18,(Move *)&local_1fb);
      Move::operator=(&pnStack_28->curr_move,(Move *)&local_1fb);
      score._2_1_ = position::in_check(ppStack_18);
      score._0_2_ = ZEXT12((byte)score._2_1_);
      local_25a = 1;
      if ((((SEE._2_1_ & 1) == 0) &&
          ((((((isQuiet & 1U) == 0 && ((advancedPawnPush & 1U) == 0)) && ((local_242 & 1) == 0)) &&
            ((!(bool)score._2_1_ && ((isEvasion & 1U) == 0)))) && ((local_243 & 1U) == 0)))) &&
         ((stack_local._2_2_ < 3 && (deferred._4_4_ <= (short)stack_local._6_2_)))) {
        local_25a = 2;
      }
      if ((((((SEE._2_1_ & 1) == 0) && ((isQuiet & 1U) == 0)) && ((advancedPawnPush & 1U) == 0)) &&
          (((stack_local._2_2_ < 3 && (deferred._4_4_ < (short)stack_local._6_2_)) &&
           (mated_max_ply < deferred._4_4_)))) &&
         ((((score._3_1_ & 1) != draw >> 0x18 || ((local_243 & 1U) != 0)) ||
          (((byte)newdepth & 1) != 0)))) {
        score._0_2_ = (undefined2)score + 1;
      }
      iVar9 = futility_move_count((bool *)((long)&SEE + 2),(U16 *)((long)&stack_local + 2));
      local_20d = iVar9 <= (int)(uint)(ushort)mvs._102_2_;
      local_25c = (stack_local._2_2_ + (undefined2)score) - local_25a;
      pnStack_28[1].pv = (Move *)0x0;
      local_260 = 0xffffd8f0;
      if ((ushort)mvs._102_2_ < 3) {
        pnStack_28[1].pv = &local_108;
        LMR._1_1_ = 0;
        LMR._0_1_ = 0;
        R_1 = 0x11;
        Move::set(pnStack_28[1].pv,(U8 *)((long)&LMR + 1),(U8 *)&LMR,&R_1);
        if (local_25c < 2) {
          local_368 = qsearch<(Nodetype)1>
                                (ppStack_18,-stack_local._4_2_,-stack_local._6_2_,0,pnStack_28 + 1);
        }
        else {
          local_368 = search<(Nodetype)1>(ppStack_18,-stack_local._4_2_,-stack_local._6_2_,
                                          local_25c - 1,pnStack_28 + 1);
        }
        local_368 = -local_368;
        local_260 = local_368;
      }
      else {
        local_26a = local_25c;
        if ((((((((byte)newdepth & 1) == 0) && ((isQuiet & 1U) == 0)) &&
              ((score._3_1_ & 1) == draw >> 0x18)) &&
             (((newdepth._1_1_ & 1) == 0 && ((local_243 & 1U) == 0)))) &&
            ((((isEvasion & 1U) == 0 &&
              (((local_242 & 1) == 0 && ((score._2_1_ & 1) == draw >> 0x10)))) &&
             ((local_16b & 1) == 0)))) &&
           ((2 < stack_local._2_2_ && (deferred._4_4_ <= (short)stack_local._6_2_)))) {
          local_270 = reduction(false,(bool)(SEE._2_1_ & 1),(uint)stack_local._2_2_,
                                (uint)(ushort)mvs._102_2_);
          local_26a = local_26a - (short)local_270;
        }
        if (local_26a < 2) {
          local_378 = qsearch<(Nodetype)2>
                                (ppStack_18,~stack_local._6_2_,-stack_local._6_2_,0,pnStack_28 + 1);
        }
        else {
          local_378 = search<(Nodetype)2>(ppStack_18,~stack_local._6_2_,-stack_local._6_2_,
                                          local_26a - 1,pnStack_28 + 1);
        }
        local_378 = -local_378;
        local_260 = local_378;
        if ((short)stack_local._6_2_ < local_378) {
          pnStack_28[1].pv = &local_108;
          local_272[1] = 0;
          local_272[0] = '\0';
          local_278 = no_type;
          Move::set(pnStack_28[1].pv,local_272 + 1,local_272,&local_278);
          if (local_25c < 2) {
            local_384 = qsearch<(Nodetype)1>
                                  (ppStack_18,-stack_local._4_2_,-stack_local._6_2_,0,pnStack_28 + 1
                                  );
          }
          else {
            local_384 = search<(Nodetype)1>(ppStack_18,-stack_local._4_2_,-stack_local._6_2_,
                                            local_25c - 1,pnStack_28 + 1);
          }
          local_384 = -local_384;
          local_260 = local_384;
        }
      }
      mvs._102_2_ = mvs._102_2_ + 1;
      if (pre_pre_move.f == '\n') {
        std::vector<Move,std::allocator<Move>>::emplace_back<Move&>
                  ((vector<Move,std::allocator<Move>> *)local_128,(Move *)&local_1fb);
      }
      position::undo_move(ppStack_18,(Move *)&local_1fb);
      if ((UCI_SIGNALS.stop & 1U) != 0) {
        pos_local._4_4_ = draw;
        goto LAB_0016dfad;
      }
    } while (local_260 <= deferred._4_4_);
    deferred._4_4_ = local_260;
    Move::operator=((Move *)((long)&deferred + 1),(Move *)&local_1fb);
    Move::operator=(&pnStack_28->best_move,(Move *)&local_1fb);
  } while (local_260 < stack_local._4_2_);
  bestMoveBonus._2_2_ = stack_local._2_2_;
  position::stats_update
            (ppStack_18,(Move *)((long)&deferred + 1),&pnStack_28[-1].curr_move,
             (int16 *)((long)&bestMoveBonus + 2),(Score *)((long)&deferred + 4),
             (vector<Move,_std::allocator<Move>_> *)local_128,pnStack_28->killers);
LAB_0016de2c:
  ppVar2 = ppStack_18;
  Move::Move((Move *)((long)&bound + 3));
  unset_searching(ppVar2,(Move *)((long)&bound + 3));
  local_284 = (uint)stack_local._2_2_ * 2;
  if ((((short)stack_local._6_2_ <= deferred._4_4_) && (deferred._4_4_ < stack_local._4_2_)) &&
     (deferred._1_1_ != deferred._2_1_)) {
    paaiVar1 = pnStack_28->bestMoveHistory->bm;
    paaiVar1[CStack_208][deferred._1_1_][deferred._2_1_] =
         local_284 + paaiVar1[CStack_208][deferred._1_1_][deferred._2_1_];
  }
  if (mvs._102_2_ == 0) {
    if ((quiets.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._3_1_ & 1) == 0) {
      local_394 = draw;
    }
    else {
      local_394 = (uint)local_12a + mated;
    }
    pos_local._4_4_ = local_394;
  }
  else {
    local_288 = (uint)(deferred._4_4_ < stack_local._4_2_);
    local_290 = position::key(ppStack_18);
    local_291 = stack_local._2_1_;
    local_292 = (U8)local_288;
    local_293 = (U8)pnStack_28->ply;
    local_296 = deferred._4_2_;
    hash_table::save(&ttable,&local_290,&local_291,&local_292,&local_293,
                     (Move *)((long)&deferred + 1),&local_296,local_12c);
    pos_local._4_4_ = deferred._4_4_;
  }
LAB_0016dfad:
  local_140 = 1;
  haVoc::Moveorder::~Moveorder((Moveorder *)&pre_pre_move.t);
LAB_0016dfc9:
  std::vector<Move,_std::allocator<Move>_>::~vector
            ((vector<Move,_std::allocator<Move>_> *)local_128);
  return pos_local._4_4_;
}

Assistant:

Score Search::search(position& pos, int16 alpha, int16 beta, U16 depth, node* stack) {

	if (UCI_SIGNALS.stop)
		return Score::draw;

	assert(alpha < beta);

	Score bestScore = Score::ninf;
	Move best_move = {};
	best_move.type = Movetype::no_type;
	size_t deferred = 0;

	Move ttm = {}; ttm.type = Movetype::no_type; // refactor me
	Move pv[Depth::MAX_PLY + 4];
	Score ttvalue = Score::ninf;

	bool in_check = pos.in_check();
	std::vector<Move> quiets;
	stack->in_check = in_check;
	stack->ply = (stack - 1)->ply + 1;


	U16 root_dist = stack->ply;
	const bool root_node = (type == Nodetype::root && stack->ply == 1);
	const bool pvNode = (root_node || type == Nodetype::pv);
	if (pvNode && selDepth < stack->ply + 1 && main_thread(pos))
		selDepth++;

	if (!root_node && !in_check && pos.is_draw())
			return Score::draw;

	{ // mate distance pruning
		Score mating_score = Score(Score::mate - root_dist);
		beta = std::min(mating_score, Score(beta));
		if (alpha >= mating_score)
			return mating_score;

		Score mated_score = Score(Score::mated + root_dist);
		alpha = std::max(mated_score, Score(alpha));
		if (beta <= mated_score)
			return mated_score;
	}

	// hashtable lookup
	auto hashHit = false;
	{
		hash_data e;
		hashHit = ttable.fetch(pos.key(), e);
		if (hashHit) {
			ttm = e.move;
			hashHits++;
			ttvalue = Score(e.score);
			if (!pvNode &&
				e.depth >= depth &&
				(ttvalue >= beta ? e.bound == bound_low : e.bound == bound_high)) {
				pos.stats_update(ttm, (stack - 1)->curr_move, depth, ttvalue, quiets, stack->killers);
				return ttvalue;
			}
		}
	}

	// static evaluation
	const bool anyPawnsOn7th = pos.pawns_near_promotion(); // either side has pawns on 7th
	const bool weHavePawnsOn7th = pos.pawns_on_7th(); // only side to move has pawns on 7th

	Score static_eval = (ttvalue != Score::ninf ? ttvalue :
		(stack-2)->static_eval != ninf && !in_check && (stack-2)->static_eval >= (stack-1)->static_eval ? Score((stack-2)->static_eval + 15) :
		!in_check ? 
		Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th)))) :
		Score::ninf);
	 
	//Score static_eval = Score::ninf;
	//if (ttvalue == Score::ninf &&
	//	!pvNode && 
	//	!in_check && 
	//	(stack - 2)->static_eval != Score::ninf &&
	//	(stack - 1)->best_move.type == Movetype::quiet)
	//	static_eval = Score((stack - 2)->static_eval + 33);
	//else if (!in_check)
	//	static_eval = Score(std::lround(eval::evaluate(pos, *SearchThreads[pos.id()], lazy_eval_margin_search(depth, anyPawnsOn7th))));
	stack->static_eval = static_eval;
	bool hasStaticValue = static_eval != Score::ninf;


	// 0. Define the forward pruning conditions
	const bool forward_prune =
		(!in_check &&
		!pvNode &&
		(stack - 1)->curr_move.type == Movetype::quiet &&
		!stack->null_search &&
		abs(alpha - beta) == 1 && // only prune in null windows (same condition as !pv_node)
		hasStaticValue);

	// 1. Futility pruning
	//if (forward_prune &&
	//	!weHavePawnsOn7th &&
	//	depth <= 1 &&
	//	static_eval > mated_max_ply &&
	//	static_eval + 1150 < alpha)
	//	return Score(static_eval);

	// 2. Null move pruning
	bool null_move_allowed = (pos.to_move() == white ?
		pos.non_pawn_material<white>() :
		pos.non_pawn_material<black>());
	if (forward_prune &&
		null_move_allowed &&
		depth >= 6 &&
		static_eval - 8 * (64 - depth) >= beta) {

		int16 R = (depth >= 6 ? depth / 2 : 2);
		int16 ndepth = depth - R;

		(stack + 1)->null_search = true;
		pos.do_null_move();
		Score null_eval = Score(ndepth <= 1 ?
			-qsearch<non_pv>(pos, -beta, -beta + 1, 0, stack + 1) :
			-search<non_pv>(pos, -beta, -beta + 1, ndepth, stack + 1));
		pos.undo_null_move();
		(stack + 1)->null_search = false;


		// verification
		//null_eval = Score(ndepth <= 1 ?
		//	qsearch<non_pv>(pos, beta-1, beta, 0, stack) :
		//	search<non_pv>(pos, beta-1, beta, ndepth, stack));

		if (null_eval >= beta)
			return Score(null_eval);
		else {
			Move tm = (stack + 1)->best_move;
			if (tm.type == Movetype::capture && beta - null_eval >= 500)
				stack->threat_move = tm;
		}
	}

	// Main search
	U16 moves_searched = 0;
	haVoc::Moveorder mvs(pos, ttm, stack);
	Move move;
	Move pre_move = (stack - 1)->curr_move;
	Move pre_pre_move = (stack - 2)->curr_move;
	bool improving = stack->static_eval - (stack - 2)->static_eval >= 0;
	auto to_mv = pos.to_move();
	int SEE = 0;
	auto skipQuiets = false;
	auto rootMoves = root_node && pos.root_moves[0].pv.size() > 4;

	set_searching(pos, {}, pos.id());

	while (mvs.next_move(pos, move, pre_move, pre_pre_move, stack->threat_move, skipQuiets, rootMoves)) {

		if (UCI_SIGNALS.stop)
			return Score::draw;

		if (move.type == Movetype::no_type || !pos.is_legal(move))
			continue;


		if (main_thread(pos) && root_node && elapsed > 3000)
			std::cout << "info depth " << depth
			<< " currmove " << uci::move_to_string(move)
			<< " currmovenumber " << moves_searched << std::endl;

		// Set move data
		auto hashOrKiller = (move == ttm) ||
			(move == stack->killers[0]) ||
			(move == stack->killers[1]) ||
			(move == stack->killers[2]) ||
			(move == stack->killers[3]);
		auto isPromotion = pos.is_promotion(move.type);
		auto isCapture =
			(move.type == Movetype::capture) ||
			(move.type == Movetype::ep) ||
			pos.is_cap_promotion(Movetype(move.type));
		auto isQuiet = move.type == Movetype::quiet;
		auto isEvasion = in_check;
		auto advancedPawnPush = (pos.piece_on(Square(move.t)) == Piece::pawn) &&
			(to_mv == white ? util::row(move.t) >= Row::r6 : util::row(move.t) <= Row::r3);
		auto quietFollowingCapture = (stack - 1)->curr_move.type == Movetype::capture && isQuiet;
		auto quietFollowup = (stack - 1)->curr_move.type == Movetype::quiet && isQuiet;
		auto captureFollowup = (stack - 1)->curr_move.type == Movetype::capture && isCapture;
		auto threatResponse = (stack->threat_move.type != Movetype::no_type && stack->threat_move.f == move.t) && isCapture;
		auto dangerousQuietCheck = isQuiet && pos.quiet_gives_dangerous_check(move);

		// 4. Skip moves with negative see scores
		if (isCapture &&
			!hashOrKiller &&
			!pvNode &&
			!isEvasion &&
			!isPromotion &&
			bestScore < alpha &&
			depth <= 1 &&
			moves_searched > 1 &&
			(SEE = pos.see(move)) < 0)
			continue;

		// Debug viz readout
		//{
		//	std::unique_lock<std::mutex> lock(search_mtx);
		//	std::cout << "moveReadout " <<
		//		"depth=" << depth <<
		//		" m=" << (pos.to_move() == white ? "W" : "B") << "|" <<
		//		SanPiece[pos.piece_on(Square(move.f))] << "|" <<
		//		util::col(move.f) << "|" << util::row(move.f) << "|" <<
		//		util::col(move.t) << "|" << util::row(move.t) << std::endl;
		//}
		
		pos.do_move(move);
		stack->curr_move = move;

		bool givesCheck = pos.in_check();
		int16 extensions = givesCheck;
		int16 reductions = 1;

		// 5. Reduce uninteresting quiet moves
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			!isEvasion &&
			!givesCheck &&
			!isPromotion &&
			!advancedPawnPush &&
			depth <= 2 &&
			bestScore <= alpha)
			reductions += 1;

		// 6. Extend likely interesting quiet moves 
		if (!pvNode &&
			!improving &&
			!hashOrKiller &&
			!isCapture &&
			depth <= 2 &&
			bestScore < alpha &&
			bestScore > mated_max_ply &&
			(dangerousQuietCheck || advancedPawnPush || threatResponse))
			extensions += 1;

		// 7. Reduce losing captures
		//if (isCapture &&
		//	!hashOrKiller &&
		//	!givesCheck &&
		//	!isPromotion &&
		//	!isEvasion &&
		//	bestScore < alpha &&
		//	!advancedPawnPush &&
		//	depth <= 1 &&
		//	SEE < 0)
		//	reductions += 1;

		// 8. Movecount pruning from Stockfish
		skipQuiets = moves_searched >= futility_move_count(improving, depth);

		// 9. Reduction if this position is being searched by another thread
		//if (is_searching(pos, move, pos.id()))
		//	reductions += 1;

		int16 newdepth = depth + extensions - reductions;
		(stack + 1)->pv = nullptr;

		Score score = Score::ninf;
		if (moves_searched < 3) {
			(stack + 1)->pv = pv;
			(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);
			score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
				-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
		}
		else {
			int16 LMR = newdepth;
			// Late move reduction for moves unlikely to raise alpha
			if (!threatResponse &&
				!hashOrKiller &&
				!dangerousQuietCheck &&
				!captureFollowup &&
				!advancedPawnPush &&
				!isPromotion &&
				!isEvasion &&
				!givesCheck &&
				!anyPawnsOn7th &&
				depth >= 3 &&
				bestScore <= alpha) {
				unsigned R = reduction(pvNode, improving, depth, moves_searched);
				LMR -= R;
			}

			score = Score(LMR <= 1 ? -qsearch<non_pv>(pos, -alpha - 1, -alpha, 0, stack + 1) :
				-search<non_pv>(pos, -alpha - 1, -alpha, LMR - 1, stack + 1));

			if (score > alpha) {
				(stack + 1)->pv = pv;
				(stack + 1)->pv[0].set(A1, A1, Movetype::no_type);

				score = Score(newdepth <= 1 ? -qsearch<Nodetype::pv>(pos, -beta, -alpha, 0, stack + 1) :
					-search<Nodetype::pv>(pos, -beta, -alpha, newdepth - 1, stack + 1));
			}
		}
		++moves_searched;

		if (move.type == Movetype::quiet)
			quiets.emplace_back(move);


		pos.undo_move(move);

		// return if stop requested - do not updated best move or pv
		if (UCI_SIGNALS.stop)
			return Score::draw;


		// root move update
		if (root_node) {
			auto& rm = *std::find(pos.root_moves.begin(), pos.root_moves.end(), move);

			if (moves_searched == 1 || score > alpha) {
				rm.score = score;
				rm.selDepth = selDepth;
				rm.pv.resize(1);
				for (Move* m = (stack + 1)->pv;; ++m) {
					if (m->f == m->t || m->type == Movetype::no_type)
						break;
					rm.pv.push_back(*m);
				}
			}
			else rm.score = Score::ninf;
		}

		if (score > bestScore) {
			bestScore = score;
			best_move = move;
			stack->best_move = move;

			if (score >= beta) {
				// Update mate killers and quiet move stats
				pos.stats_update(best_move,
					(stack - 1)->curr_move,
					depth, bestScore, quiets, stack->killers);
				break;
			}

			if (score > alpha) {

				if (pvNode)
					alpha = score;

				if (pvNode && !root_node)
					update_pv(stack->pv, move, (stack + 1)->pv);
			}
		}


		// Penalize captures failing to raise alpha
		//if (SEE >= 0 && !pv && score < alpha && move.f != move.t && move.type == Movetype::capture) {
		//	auto capturePenalty = 2 * depth;
		//	stack->capHistory[to_mv][move.f][move.t] -= capturePenalty;
		//}

	} // end moves loop




	unset_searching(pos, {});

	// Update best move stats
	auto bestMoveBonus = 2 * depth;
	if (bestScore >= alpha && bestScore < beta && best_move.f != best_move.t) {
		stack->bestMoveHistory->bm[to_mv][best_move.f][best_move.t] += bestMoveBonus;
	}



	if (moves_searched == 0) {
		return (in_check ? Score(Score::mated + root_dist) : Score::draw);
	}

	Bound bound = (bestScore >= beta ? bound_low :
		pvNode && (best_move.type != Movetype::no_type) ? bound_exact : bound_high);
	ttable.save(pos.key(), depth, U8(bound), stack->ply, best_move, bestScore, pvNode);

	return bestScore;
}